

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[9]>
          (pybind11 *this,char (*args_) [9])

{
  handle hVar1;
  runtime_error *this_00;
  value_type *arg_value;
  array<pybind11::object,_1UL> args;
  handle local_18;
  
  local_18 = detail::type_caster<char,_void>::cast(*args_,automatic_reference,(handle)0x0);
  if (local_18.m_ptr != (PyObject *)0x0) {
    tuple::tuple((tuple *)this,1);
    hVar1.m_ptr = local_18.m_ptr;
    local_18.m_ptr = (PyObject *)0x0;
    *(PyObject **)(*(long *)this + 0x18) = hVar1.m_ptr;
    object::~object((object *)&local_18);
    return (object)(object)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)"
            );
  *(undefined ***)this_00 = &PTR__runtime_error_002648a8;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}